

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void Map<int,_int>::rotl(Item **cell)

{
  Item *this;
  Item *this_00;
  Item *pIVar1;
  
  this = *cell;
  this_00 = this->right;
  pIVar1 = this_00->left;
  this_00->parent = this->parent;
  this_00->left = this;
  this->right = pIVar1;
  if (pIVar1 != (Item *)0x0) {
    pIVar1->parent = this;
  }
  this->parent = this_00;
  *cell = this_00;
  Item::updateHeightAndSlope(this);
  Item::updateHeightAndSlope(this_00);
  return;
}

Assistant:

static void rotl(Item*& cell)
  {
    Item* oldTop = cell;
    Item* result = oldTop->right;
    Item* tmp = result->left;
    result->parent = oldTop->parent;
    result->left = oldTop;
    if((oldTop->right = tmp))
      tmp->parent = oldTop;
    oldTop->parent = result;
    cell = result;
    oldTop->updateHeightAndSlope();
    result->updateHeightAndSlope();
  }